

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANAplanner.cpp
# Opt level: O2

void __thiscall
anaPlanner::ReInitializeSearchStateInfo
          (anaPlanner *this,anaState *state,anaSearchStateSpace_t *pSearchStateSpace)

{
  DiscreteSpaceInformation *pDVar1;
  int iVar2;
  
  *(undefined8 *)(state + 0x20) = 0x3b9aca003b9aca00;
  *(undefined2 *)(state + 0x28) = 0;
  *(unsigned_short *)(state + 0x2a) = pSearchStateSpace->callnumber;
  *(undefined4 *)(state + 0x40) = 1000000000;
  *(undefined4 *)(state + 0x10) = 0;
  *(undefined8 *)state = 0;
  *(undefined2 *)(state + 0x2c) = 0;
  *(undefined8 *)(state + 0x30) = 0;
  *(undefined8 *)(state + 0x38) = 0;
  if (pSearchStateSpace->searchgoalstate == (CMDPSTATE *)0x0) {
    iVar2 = 0;
  }
  else {
    pDVar1 = (this->super_SBPLPlanner).environment_;
    iVar2 = (*pDVar1->_vptr_DiscreteSpaceInformation[(ulong)(this->bforwardsearch ^ 1) + 3])
                      (pDVar1,(ulong)**(uint **)(state + 0x18));
  }
  *(int *)(state + 0x44) = iVar2;
  return;
}

Assistant:

void anaPlanner::ReInitializeSearchStateInfo(anaState* state, anaSearchStateSpace_t* pSearchStateSpace)
{
    state->g = INFINITECOST;
    state->v = INFINITECOST;
    state->iterationclosed = 0;
    state->callnumberaccessed = pSearchStateSpace->callnumber;
    state->bestnextstate = NULL;
    state->costtobestnextstate = INFINITECOST;
    state->heapindex = 0;
    state->listelem[ana_INCONS_LIST_ID] = 0;
    state->numofexpands = 0;

    state->bestpredstate = NULL;

    //compute heuristics
#if USE_HEUR

    if (pSearchStateSpace->searchgoalstate != NULL) {
        state->h = ComputeHeuristic(state->MDPstate, pSearchStateSpace);
    }
    else
    state->h = 0;

#else

    state->h = 0;

#endif

}